

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
HasNoNewUnconfirmed_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CTransaction *tx,CTxMemPool *pool,setEntries *iters_conflicting)

{
  undefined8 *puVar1;
  pointer pcVar2;
  uint256 *puVar3;
  pointer pCVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  bool bVar10;
  _Base_ptr p_Var11;
  pointer pCVar12;
  const_iterator cVar13;
  ulong uVar14;
  ulong uVar15;
  CTxIn *txin;
  uchar *puVar16;
  uint *in_R8;
  _Rb_tree_header *p_Var17;
  long in_FS_OFFSET;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> parents_of_conflicts;
  undefined1 local_b4 [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined1 local_90 [32];
  uchar uStack_70;
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var11 = (iters_conflicting->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var17 = &(iters_conflicting->_M_t)._M_impl.super__Rb_tree_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((_Rb_tree_header *)p_Var11 != p_Var17) {
    do {
      puVar3 = (uint256 *)((undefined8 *)**(long **)(p_Var11 + 1))[1];
      for (puVar16 = *(uchar **)**(long **)(p_Var11 + 1); (uint256 *)puVar16 != puVar3;
          puVar16 = puVar16 + 0x68) {
        std::
        _Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
        ::_M_insert_unique<uint256_const&>
                  ((_Rb_tree<uint256,uint256,std::_Identity<uint256>,std::less<uint256>,std::allocator<uint256>>
                    *)&local_68,(uint256 *)puVar16);
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 != p_Var17);
  }
  local_b4._0_4_ = 0;
  pCVar12 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish != pCVar12) {
    uVar14 = 0;
    do {
      cVar13 = std::
               _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
               ::find(&local_68,(key_type *)(pCVar12 + uVar14));
      if ((_Rb_tree_header *)cVar13._M_node == &local_68._M_impl.super__Rb_tree_header) {
        pCVar4 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_90[0] = false;
        pCVar12 = pCVar4 + (uint)local_b4._0_4_;
        uVar5 = *(undefined8 *)&(pCVar12->prevout).hash;
        uVar6 = *(undefined8 *)((long)&(pCVar12->prevout).hash + 8);
        puVar16 = (uchar *)((long)&pCVar4[(uint)local_b4._0_4_].prevout.hash + 0x10);
        uVar7 = *(undefined8 *)puVar16;
        uVar8 = *(undefined8 *)(puVar16 + 8);
        local_90._17_7_ = (undefined7)uVar7;
        local_90[0x18] = (undefined1)((ulong)uVar7 >> 0x38);
        local_90._25_7_ = (undefined7)uVar8;
        uStack_70 = (uchar)((ulong)uVar8 >> 0x38);
        local_90._1_7_ = (undefined7)uVar5;
        local_90[8] = (uchar)((ulong)uVar5 >> 0x38);
        local_90._9_7_ = (undefined7)uVar6;
        local_90[0x10] = (undefined1)((ulong)uVar6 >> 0x38);
        bVar10 = CTxMemPool::exists(pool,(GenTxid *)local_90);
        if (bVar10) {
          base_blob<256u>::ToString_abi_cxx11_((string *)(local_b4 + 4),&tx->hash);
          tinyformat::format<std::__cxx11::string,unsigned_int>
                    ((string *)local_90,
                     (tinyformat *)"replacement %s adds unconfirmed input, idx %d",local_b4 + 4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b4,
                     in_R8);
          puVar1 = (undefined8 *)
                   ((long)&(__return_storage_ptr__->
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           )._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10);
          *(undefined8 **)
           &(__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload = puVar1;
          pcVar2 = local_90 + 0x10;
          _Var9._M_p._1_7_ = local_90._1_7_;
          _Var9._M_p._0_1_ = local_90[0];
          if (_Var9._M_p == pcVar2) {
            *puVar1 = CONCAT71(local_90._17_7_,local_90[0x10]);
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x18) = CONCAT71(local_90._25_7_,local_90[0x18]);
          }
          else {
            (__return_storage_ptr__->
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = _Var9._M_p;
            *(ulong *)((long)&(__return_storage_ptr__->
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              )._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 0x10) = CONCAT71(local_90._17_7_,local_90[0x10]);
          }
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_string_length = CONCAT71(local_90._9_7_,local_90[8]);
          local_90[0] = SUB81(pcVar2,0);
          local_90._1_7_ = (undefined7)((ulong)pcVar2 >> 8);
          local_90[8] = '\0';
          local_90[9] = '\0';
          local_90[10] = '\0';
          local_90[0xb] = '\0';
          local_90[0xc] = '\0';
          local_90[0xd] = '\0';
          local_90[0xe] = '\0';
          local_90[0xf] = '\0';
          local_90[0x10] = '\0';
          (__return_storage_ptr__->
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b4._4_8_ != &local_a0) {
            operator_delete((void *)local_b4._4_8_,local_a0._M_allocated_capacity + 1);
          }
          goto LAB_00286f06;
        }
      }
      local_b4._0_4_ = local_b4._0_4_ + 1;
      uVar14 = (ulong)(uint)local_b4._0_4_;
      pCVar12 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar15 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pCVar12 >> 3) * 0x4ec4ec4ec4ec4ec5;
    } while (uVar14 <= uVar15 && uVar15 - uVar14 != 0);
  }
  (__return_storage_ptr__->
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
LAB_00286f06:
  std::
  _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
  ::~_Rb_tree(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> HasNoNewUnconfirmed(const CTransaction& tx,
                                               const CTxMemPool& pool,
                                               const CTxMemPool::setEntries& iters_conflicting)
{
    AssertLockHeld(pool.cs);
    std::set<uint256> parents_of_conflicts;
    for (const auto& mi : iters_conflicting) {
        for (const CTxIn& txin : mi->GetTx().vin) {
            parents_of_conflicts.insert(txin.prevout.hash);
        }
    }

    for (unsigned int j = 0; j < tx.vin.size(); j++) {
        // Rule #2: We don't want to accept replacements that require low feerate junk to be
        // mined first.  Ideally we'd keep track of the ancestor feerates and make the decision
        // based on that, but for now requiring all new inputs to be confirmed works.
        //
        // Note that if you relax this to make RBF a little more useful, this may break the
        // CalculateMempoolAncestors RBF relaxation which subtracts the conflict count/size from the
        // descendant limit.
        if (!parents_of_conflicts.count(tx.vin[j].prevout.hash)) {
            // Rather than check the UTXO set - potentially expensive - it's cheaper to just check
            // if the new input refers to a tx that's in the mempool.
            if (pool.exists(GenTxid::Txid(tx.vin[j].prevout.hash))) {
                return strprintf("replacement %s adds unconfirmed input, idx %d",
                                 tx.GetHash().ToString(), j);
            }
        }
    }
    return std::nullopt;
}